

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O2

bool __thiscall
TTD::ExecutionInfoManager::GetPreviousTimeAndPositionForDebugger
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *sourceLocation)

{
  bool bVar1;
  uint uVar2;
  SingleCallCounter *pSVar3;
  FunctionBody *this_00;
  undefined1 auStack_98 [8];
  ULONG srcLine;
  uint64 local_88;
  uint64 uStack_80;
  undefined8 local_78;
  uint64 uStack_70;
  undefined8 local_68;
  uint64 uStack_60;
  undefined8 local_58;
  LONG local_4c;
  TTDebuggerSourceLocation *pTStack_48;
  LONG srcColumn;
  uint64 local_40;
  uint64 local_38;
  
  pTStack_48 = sourceLocation;
  pSVar3 = GetTopCallCounter(this);
  uVar2 = pSVar3->LastStatementIndex;
  if (uVar2 == 0xffffffff) {
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    uStack_60 = 0;
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    auStack_98 = (undefined1  [8])0x0;
    _srcLine = (char16 *)0x0;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    bVar1 = TryGetTopCallCallerCounter(this,(SingleCallCounter *)auStack_98);
    if (bVar1) {
      pSVar3 = (SingleCallCounter *)auStack_98;
    }
    this_00 = pSVar3->Function;
    local_40 = pSVar3->FunctionTime;
    local_38 = pSVar3->CurrentStatementLoopTime;
    uVar2 = pSVar3->CurrentStatementIndex;
    bVar1 = !bVar1;
  }
  else {
    this_00 = pSVar3->Function;
    local_40 = pSVar3->FunctionTime;
    local_38 = pSVar3->LastStatementLoopTime;
    bVar1 = false;
  }
  auStack_98 = (undefined1  [8])((ulong)auStack_98 & 0xffffffff00000000);
  local_4c = -1;
  uVar2 = Js::FunctionBody::GetStatementStartOffset(this_00,uVar2);
  Js::FunctionBody::GetSourceLineFromStartOffset_TTD(this_00,uVar2,(ULONG *)auStack_98,&local_4c);
  TTDebuggerSourceLocation::SetLocationFull
            (pTStack_48,this->m_topLevelCallbackEventTime,local_40,local_38,this_00,auStack_98._0_4_
             ,local_4c);
  return bVar1;
}

Assistant:

bool ExecutionInfoManager::GetPreviousTimeAndPositionForDebugger(TTDebuggerSourceLocation& sourceLocation) const
    {
        bool noPrevious = false;
        const SingleCallCounter& cfinfo = this->GetTopCallCounter();

        //if we are at the first statement in the function then we want the parents current
        Js::FunctionBody* fbody = nullptr;
        int32 statementIndex = -1;
        uint64 ftime = 0;
        uint64 ltime = 0;
        if(cfinfo.LastStatementIndex == -1)
        {
            SingleCallCounter cfinfoCaller = { 0 };
            bool hasCaller = this->TryGetTopCallCallerCounter(cfinfoCaller);
            if (hasCaller)
            {
                ftime = cfinfoCaller.FunctionTime;
                ltime = cfinfoCaller.CurrentStatementLoopTime;

                fbody = cfinfoCaller.Function;
                statementIndex = cfinfoCaller.CurrentStatementIndex;
            }
            else
            {
                //Set the position info to the current statement and return true
                noPrevious = true;

                ftime = cfinfo.FunctionTime;
                ltime = cfinfo.CurrentStatementLoopTime;

                fbody = cfinfo.Function;
                statementIndex = cfinfo.CurrentStatementIndex;
            }
        }
        else
        {
            ftime = cfinfo.FunctionTime;
            ltime = cfinfo.LastStatementLoopTime;

            fbody = cfinfo.Function;
            statementIndex = cfinfo.LastStatementIndex;
        }

        ULONG srcLine = 0;
        LONG srcColumn = -1;
        uint32 startOffset = fbody->GetStatementStartOffset(statementIndex);
        fbody->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

        sourceLocation.SetLocationFull(this->m_topLevelCallbackEventTime, ftime, ltime, fbody, srcLine, srcColumn);

        return noPrevious;
    }